

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view __thiscall
gmlc::utilities::string_viewOps::removeBrackets(string_viewOps *this,string_view str)

{
  byte bVar1;
  ulong uVar3;
  string_view trimCharacters;
  string_view sVar5;
  string_view input;
  size_t sVar2;
  byte *pbVar4;
  
  input._M_str = (char *)str._M_len;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  input._M_len = (size_t)this;
  sVar5 = trim(input,trimCharacters);
  pbVar4 = (byte *)sVar5._M_str;
  sVar2 = sVar5._M_len;
  if (sVar2 != 0) {
    bVar1 = *pbVar4;
    if ((((bVar1 - 0x3c < 0x40) &&
         ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0)) || (bVar1 == 0x28)) &&
       (pbVar4[sVar2 - 1] == pmap[bVar1])) {
      uVar3 = sVar2 - 1;
      if (sVar2 - 2 <= sVar2 - 1) {
        uVar3 = sVar2 - 2;
      }
      sVar5._M_str = (char *)(pbVar4 + 1);
      sVar5._M_len = uVar3;
    }
  }
  return sVar5;
}

Assistant:

std::string_view removeBrackets(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '[') || (ret.front() == '(') ||
            (ret.front() == '{') || (ret.front() == '<')) {
            if (static_cast<unsigned char>(ret.back()) == pmap[ret.front()]) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}